

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_symbols.cpp
# Opt level: O1

bool __thiscall
icu_63::numparse::impl::SymbolMatcher::match
          (SymbolMatcher *this,StringSegment *segment,ParsedNumber *result,UErrorCode *param_3)

{
  short sVar1;
  UBool UVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  iVar3 = (*(this->super_NumberParseMatcher)._vptr_NumberParseMatcher[7])(this,result);
  uVar4 = 0;
  if ((char)iVar3 != '\0') goto LAB_002fe394;
  if ((ushort)(this->fString).fUnion.fStackFields.fLengthAndFlags < 0x20) {
LAB_002fe33d:
    uVar5 = StringSegment::getCodePoint(segment);
    if (uVar5 != 0xffffffff) {
      UVar2 = UnicodeSet::contains(this->fUniSet,uVar5);
      if (UVar2 != '\0') {
        uVar5 = 2 - (uVar5 < 0x10000);
        goto LAB_002fe36b;
      }
    }
    uVar5 = StringSegment::length(segment);
    uVar4 = (uint)(uVar4 == uVar5);
  }
  else {
    uVar4 = StringSegment::getCommonPrefixLength(segment,&this->fString);
    sVar1 = (this->fString).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar5 = (this->fString).fUnion.fFields.fLength;
    }
    else {
      uVar5 = (int)sVar1 >> 5;
    }
    if (uVar4 != uVar5) goto LAB_002fe33d;
LAB_002fe36b:
    StringSegment::adjustOffset(segment,uVar5);
    (*(this->super_NumberParseMatcher)._vptr_NumberParseMatcher[8])(this,segment,result);
    uVar4 = 0;
  }
LAB_002fe394:
  return SUB41(uVar4,0);
}

Assistant:

bool SymbolMatcher::match(StringSegment& segment, ParsedNumber& result, UErrorCode&) const {
    // Smoke test first; this matcher might be disabled.
    if (isDisabled(result)) {
        return false;
    }

    // Test the string first in order to consume trailing chars greedily.
    int overlap = 0;
    if (!fString.isEmpty()) {
        overlap = segment.getCommonPrefixLength(fString);
        if (overlap == fString.length()) {
            segment.adjustOffset(fString.length());
            accept(segment, result);
            return false;
        }
    }

    int cp = segment.getCodePoint();
    if (cp != -1 && fUniSet->contains(cp)) {
        segment.adjustOffset(U16_LENGTH(cp));
        accept(segment, result);
        return false;
    }

    return overlap == segment.length();
}